

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_delay_config *
ma_delay_config_init(ma_uint32 channels,ma_uint32 sampleRate,ma_uint32 delayInFrames,float decay)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_uint32 in_ESI;
  ma_delay_config *in_RDI;
  float in_XMM0_Da;
  
  if (in_RDI != (ma_delay_config *)0x0) {
    memset(in_RDI,0,0x1c);
  }
  in_RDI->channels = in_ESI;
  in_RDI->sampleRate = in_EDX;
  in_RDI->delayInFrames = in_ECX;
  in_RDI->delayStart = (uint)(in_XMM0_Da == 0.0);
  in_RDI->wet = 1.0;
  in_RDI->dry = 1.0;
  in_RDI->decay = in_XMM0_Da;
  return in_RDI;
}

Assistant:

MA_API ma_delay_config ma_delay_config_init(ma_uint32 channels, ma_uint32 sampleRate, ma_uint32 delayInFrames, float decay)
{
    ma_delay_config config;

    MA_ZERO_OBJECT(&config);
    config.channels      = channels;
    config.sampleRate    = sampleRate;
    config.delayInFrames = delayInFrames;
    config.delayStart    = (decay == 0) ? MA_TRUE : MA_FALSE;   /* Delay the start if it looks like we're not configuring an echo. */
    config.wet           = 1;
    config.dry           = 1;
    config.decay         = decay;

    return config;
}